

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O3

PostType __thiscall
tiger::trains::ai::LineBlocker::getPostTypeByGood(LineBlocker *this,GoodType type)

{
  PostType PVar1;
  
  PVar1 = (uint)(type == ARMOR) * 3;
  if (type == PRODUCT) {
    PVar1 = MARKET;
  }
  return PVar1;
}

Assistant:

tiger::trains::models::PostType LineBlocker::getPostTypeByGood(tiger::trains::models::GoodType type)
{
    switch (type)
    {
    case models::GoodType::PRODUCT:
        return models::PostType::MARKET;
        break;

    case models::GoodType::ARMOR:
        return models::PostType::STORAGE;
        break;

    default:
        return models::PostType::UNKNOWN;
        break;
    }
}